

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O0

SRes SzAr_DecodeFolder(CSzAr *p,UInt32 folderIndex,ILookInStream *inStream,UInt64 startPos,
                      Byte *outBuffer,size_t outSize,ISzAlloc *allocMain)

{
  UInt32 UVar1;
  void *pvVar2;
  uint in_ESI;
  CSzAr *in_RDI;
  size_t in_R8;
  void *in_R9;
  long in_stack_00000008;
  Byte *tempBuf [3];
  uint i;
  Byte *data;
  CSzData sd;
  CSzFolder folder;
  SRes res;
  UInt64 in_stack_00000310;
  ILookInStream *in_stack_00000318;
  UInt64 *in_stack_00000320;
  UInt64 *in_stack_00000328;
  Byte *in_stack_00000330;
  CSzFolder *in_stack_00000338;
  Byte *in_stack_00000350;
  SizeT in_stack_00000358;
  ISzAlloc *in_stack_00000360;
  Byte **in_stack_00000368;
  undefined8 local_f8 [3];
  uint local_dc;
  Byte *local_d8;
  Byte *local_d0;
  long local_c8;
  uint local_b4;
  CSzData *in_stack_ffffffffffffff50;
  CSzFolder *in_stack_ffffffffffffff58;
  SRes local_44;
  SRes local_c;
  
  local_d8 = in_RDI->CodersData + in_RDI->FoCodersOffsets[in_ESI];
  local_c8 = in_RDI->FoCodersOffsets[in_ESI + 1] - in_RDI->FoCodersOffsets[in_ESI];
  local_d0 = local_d8;
  local_c = SzGetNextFolderItem(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if (local_c == 0) {
    if (((local_c8 == 0) && (local_b4 == in_RDI->FoToMainUnpackSizeIndex[in_ESI])) &&
       (pvVar2 = (void *)SzAr_GetFolderUnpackSize(in_RDI,in_ESI), in_R9 == pvVar2)) {
      memset(local_f8,0,0x18);
      local_44 = SzFolder_Decode2(in_stack_00000338,in_stack_00000330,in_stack_00000328,
                                  in_stack_00000320,in_stack_00000318,in_stack_00000310,
                                  in_stack_00000350,in_stack_00000358,in_stack_00000360,
                                  in_stack_00000368);
      for (local_dc = 0; local_dc < 3; local_dc = local_dc + 1) {
        (**(code **)(in_stack_00000008 + 8))(in_stack_00000008,local_f8[local_dc]);
      }
      if (((local_44 == 0) && ((in_RDI->FolderCRCs).Defs != (Byte *)0x0)) &&
         ((((uint)(in_RDI->FolderCRCs).Defs[in_ESI >> 3] & 0x80 >> ((byte)in_ESI & 7)) != 0 &&
          (UVar1 = CrcCalc(in_R9,in_R8), UVar1 != (in_RDI->FolderCRCs).Vals[in_ESI])))) {
        local_44 = 3;
      }
      local_c = local_44;
    }
    else {
      local_c = 0xb;
    }
  }
  return local_c;
}

Assistant:

SRes SzAr_DecodeFolder(const CSzAr *p, UInt32 folderIndex,
    ILookInStream *inStream, UInt64 startPos,
    Byte *outBuffer, size_t outSize,
    ISzAlloc *allocMain)
{
  SRes res;
  CSzFolder folder;
  CSzData sd;
  
  const Byte *data = p->CodersData + p->FoCodersOffsets[folderIndex];
  sd.Data = data;
  sd.Size = p->FoCodersOffsets[folderIndex + 1] - p->FoCodersOffsets[folderIndex];
  
  res = SzGetNextFolderItem(&folder, &sd);
  
  if (res != SZ_OK)
    return res;

  if (sd.Size != 0
      || folder.UnpackStream != p->FoToMainUnpackSizeIndex[folderIndex]
      || outSize != SzAr_GetFolderUnpackSize(p, folderIndex))
    return SZ_ERROR_FAIL;
  {
    unsigned i;
    Byte *tempBuf[3] = { 0, 0, 0};

    res = SzFolder_Decode2(&folder, data,
        &p->CoderUnpackSizes[p->FoToCoderUnpackSizes[folderIndex]],
        p->PackPositions + p->FoStartPackStreamIndex[folderIndex],
        inStream, startPos,
        outBuffer, (SizeT)outSize, allocMain, tempBuf);
    
    for (i = 0; i < 3; i++)
      IAlloc_Free(allocMain, tempBuf[i]);

    if (res == SZ_OK)
      if (SzBitWithVals_Check(&p->FolderCRCs, folderIndex))
        if (CrcCalc(outBuffer, outSize) != p->FolderCRCs.Vals[folderIndex])
          res = SZ_ERROR_CRC;

    return res;
  }
}